

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O1

USTATUS __thiscall FfsParser::parse(FfsParser *this,UByteArray *buffer)

{
  USTATUS UVar1;
  UModelIndex root;
  CBString CStack_68;
  UModelIndex local_50;
  UModelIndex local_38;
  
  local_50.r = -1;
  local_50.c = -1;
  local_50.i = 0;
  local_50.m = (TreeModel *)0x0;
  std::__cxx11::string::_M_assign((string *)&this->openedImage);
  this->imageBase = 0;
  this->addressDiff = 0x100000000;
  this->protectedRegionsBase = 0;
  Bstrlib::CBString::operator=(&this->securityInfo,anon_var_dwarf_2abd1 + 0x10);
  std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::clear(&this->protectedRanges);
  (this->lastVtf).r = -1;
  (this->lastVtf).c = -1;
  (this->lastVtf).i = 0;
  (this->lastVtf).m = (TreeModel *)0x0;
  (this->dxeCore).r = -1;
  (this->dxeCore).c = -1;
  (this->dxeCore).i = 0;
  (this->dxeCore).m = (TreeModel *)0x0;
  UVar1 = performFirstPass(this,buffer,&local_50);
  if (UVar1 == 0) {
    if ((((this->lastVtf).r < 0) || ((this->lastVtf).c < 0)) ||
       ((this->lastVtf).m == (TreeModel *)0x0)) {
      usprintf(&CStack_68,"%s: not a single Volume Top File is found, the image may be corrupted",
               "parse");
      local_38.r = -1;
      local_38.c = -1;
      local_38.i = 0;
      local_38.m = (TreeModel *)0x0;
      msg(this,&CStack_68,&local_38);
      Bstrlib::CBString::~CBString(&CStack_68);
      UVar1 = 0;
    }
    else {
      UVar1 = performSecondPass(this,&local_50);
    }
  }
  addInfoRecursive(this,&local_50);
  return UVar1;
}

Assistant:

USTATUS FfsParser::parse(const UByteArray & buffer)
{
    UModelIndex root;
    
    // Reset global parser state
    openedImage = buffer;
    imageBase = 0;
    addressDiff = 0x100000000ULL;
    protectedRegionsBase = 0;
    securityInfo = "";
    protectedRanges.clear();
    lastVtf = UModelIndex();
    dxeCore = UModelIndex();
    
    // Parse input buffer
    USTATUS result = performFirstPass(buffer, root);
    if (result == U_SUCCESS) {
        if (lastVtf.isValid()) {
            result = performSecondPass(root);
        }
        else {
            msg(usprintf("%s: not a single Volume Top File is found, the image may be corrupted", __FUNCTION__));
        }
    }
    
    addInfoRecursive(root);
    return result;
}